

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  Curl_easy *data_00;
  Curl_tree *pCVar1;
  curltime cVar2;
  curltime now_00;
  Curl_hash_element *local_128;
  Curl_hash_element *he;
  Curl_hash_iterator iter;
  Curl_sh_entry *entry;
  sigpipe_ignore pipe_st;
  undefined1 auStack_58 [6];
  _Bool nosig;
  _Bool first;
  curltime now;
  Curl_tree *t;
  Curl_easy *data;
  CURLMcode result;
  int *running_handles_local;
  int ev_bitmask_local;
  curl_socket_t s_local;
  _Bool checkall_local;
  Curl_multi *multi_local;
  
  data._4_4_ = CURLM_OK;
  cVar2 = Curl_now();
  _auStack_58 = cVar2.tv_sec;
  now.tv_sec._0_4_ = cVar2.tv_usec;
  pipe_st._159_1_ = 0;
  pipe_st._158_1_ = 0;
  if (checkall) {
    data._4_4_ = curl_multi_perform(multi,running_handles);
    if (data._4_4_ != CURLM_BAD_HANDLE) {
      for (t = (Curl_tree *)multi->easyp; t != (Curl_tree *)0x0 && data._4_4_ == CURLM_OK;
          t = t->samen) {
        data._4_4_ = singlesocket(multi,(Curl_easy *)t);
      }
    }
    multi_local._4_4_ = data._4_4_;
  }
  else {
    if (s == -1) {
      memset(&multi->timer_lastcall,0,0x10);
    }
    else {
      iter.current_element = (Curl_llist_element *)sh_getentry(&multi->sockhash,s);
      if ((Curl_sh_entry *)iter.current_element != (Curl_sh_entry *)0x0) {
        Curl_hash_start_iterate((Curl_hash *)iter.current_element,(Curl_hash_iterator *)&he);
        local_128 = Curl_hash_next_element((Curl_hash_iterator *)&he);
        while (local_128 != (Curl_hash_element *)0x0) {
          data_00 = (Curl_easy *)local_128->ptr;
          if ((data_00->conn != (connectdata *)0x0) && ((data_00->conn->handler->flags & 8) == 0)) {
            (data_00->state).select_bits = (uchar)ev_bitmask;
          }
          Curl_expire(data_00,0,EXPIRE_RUN_NOW);
          local_128 = Curl_hash_next_element((Curl_hash_iterator *)&he);
        }
        cVar2 = Curl_now();
        _auStack_58 = cVar2.tv_sec;
        now.tv_sec._0_4_ = cVar2.tv_usec;
      }
    }
    t = (Curl_tree *)0x0;
    do {
      if (t != (Curl_tree *)0x0) {
        if ((pipe_st._159_1_ & 1) == 0) {
          pipe_st._159_1_ = 1;
          pipe_st._158_1_ = (*(ulong *)((long)&t[0x2f].larger + 2) >> 0x20 & 1) != 0;
          sigpipe_ignore((Curl_easy *)t,(sigpipe_ignore *)&entry);
        }
        else if (((uint)((ulong)*(undefined8 *)((long)&t[0x2f].larger + 2) >> 0x20) & 1) !=
                 (uint)(pipe_st._158_1_ & 1)) {
          sigpipe_restore((sigpipe_ignore *)&entry);
          sigpipe_ignore((Curl_easy *)t,(sigpipe_ignore *)&entry);
          pipe_st._158_1_ = (*(ulong *)((long)&t[0x2f].larger + 2) >> 0x20 & 1) != 0;
        }
        data._4_4_ = multi_runsingle(multi,(curltime *)auStack_58,(Curl_easy *)t);
        if ((data._4_4_ < CURLM_BAD_HANDLE) &&
           (data._4_4_ = singlesocket(multi,(Curl_easy *)t), data._4_4_ != CURLM_OK)) break;
      }
      cVar2.tv_usec = (int)now.tv_sec;
      cVar2.tv_sec = _auStack_58;
      cVar2._12_4_ = 0;
      pCVar1 = Curl_splaygetbest(cVar2,multi->timetree,(Curl_tree **)&now.tv_usec);
      multi->timetree = pCVar1;
      if (now._8_8_ != 0) {
        t = *(Curl_tree **)(now._8_8_ + 0x30);
        now_00.tv_usec = (int)now.tv_sec;
        now_00.tv_sec = _auStack_58;
        now_00._12_4_ = 0;
        add_next_timeout(now_00,multi,*(Curl_easy **)(now._8_8_ + 0x30));
      }
    } while (now._8_8_ != 0);
    if ((pipe_st._159_1_ & 1) != 0) {
      sigpipe_restore((sigpipe_ignore *)&entry);
    }
    *running_handles = multi->num_alive;
    multi_local._4_4_ = data._4_4_;
  }
  return multi_local._4_4_;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t;
  struct curltime now = Curl_now();
  bool first = FALSE;
  bool nosig = FALSE;
  SIGPIPE_VARIABLE(pipe_st);

  if(checkall) {
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      data = multi->easyp;
      while(data && !result) {
        result = singlesocket(multi, data);
        data = data->next;
      }
    }

    /* or should we fall-through and do the timer-based stuff? */
    return result;
  }
  if(s != CURL_SOCKET_TIMEOUT) {
    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(!entry)
      /* Unmatched socket, we can't act on it but we ignore this fact.  In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      ;
    else {
      struct Curl_hash_iterator iter;
      struct Curl_hash_element *he;

      /* the socket can be shared by many transfers, iterate */
      Curl_hash_start_iterate(&entry->transfers, &iter);
      for(he = Curl_hash_next_element(&iter); he;
          he = Curl_hash_next_element(&iter)) {
        data = (struct Curl_easy *)he->ptr;
        DEBUGASSERT(data);
        DEBUGASSERT(data->magic == CURLEASY_MAGIC_NUMBER);

        if(data->conn && !(data->conn->handler->flags & PROTOPT_DIRLOCK))
          /* set socket event bitmask if they're not locked */
          data->state.select_bits = (unsigned char)ev_bitmask;

        Curl_expire(data, 0, EXPIRE_RUN_NOW);
      }

      /* Now we fall-through and do the timer-based stuff, since we don't want
         to force the user to have to deal with timeouts as long as at least
         one connection in fact has traffic. */

      data = NULL; /* set data to NULL again to avoid calling
                      multi_runsingle() in case there's no need to */
      now = Curl_now(); /* get a newer time since the multi_runsingle() loop
                           may have taken some time */
    }
  }
  else {
    /* Asked to run due to time-out. Clear the 'lastcall' variable to force
       Curl_update_timer() to trigger a callback to the app again even if the
       same timeout is still the one to run after this call. That handles the
       case when the application asks libcurl to run the timeout
       prematurely. */
    memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));
  }

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process in the splay and 'data' will be re-assigned for every expired
   * handle we deal with.
   */
  do {
    /* the first loop lap 'data' can be NULL */
    if(data) {
      if(!first) {
        first = TRUE;
        nosig = data->set.no_signal; /* initial state */
        sigpipe_ignore(data, &pipe_st);
      }
      else if(data->set.no_signal != nosig) {
        sigpipe_restore(&pipe_st);
        sigpipe_ignore(data, &pipe_st);
        nosig = data->set.no_signal; /* remember new state */
      }
      result = multi_runsingle(multi, &now, data);

      if(CURLM_OK >= result) {
        /* get the socket(s) and check if the state has been changed since
           last */
        result = singlesocket(multi, data);
        if(result)
          break;
      }
    }

    /* Check if there's one (more) expired timer to deal with! This function
       extracts a matching node if there is one */

    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      data = t->payload; /* assign this for next loop */
      (void)add_next_timeout(now, multi, t->payload);
    }

  } while(t);
  if(first)
    sigpipe_restore(&pipe_st);

  *running_handles = multi->num_alive;
  return result;
}